

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFullfilledPreconditionDoesNotFireAndThatTheInvariantWasCalled_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFullfilledPreconditionDoesNotFireAndThatTheInvariantWasCalled_Test
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 in_stack_fffffffffffffeff;
  AssertionResult *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  int iVar5;
  AssertionResult *this_02;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  Type type;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult *this_03;
  char *in_stack_ffffffffffffff60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  AssertionResult *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffac;
  TestClassWithInvariant *in_stack_ffffffffffffffb0;
  AssertionResult local_38 [3];
  
  type = (Type)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      anon_unknown.dwarf_114b::TestClassWithInvariant::setX
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
  }
  else {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,type,
               (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x13f024);
  }
  this_03 = local_38;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff18,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
  iVar5 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13f0ff);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,
               (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),iVar5,
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x13f15c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f1b1);
  this_02 = (AssertionResult *)&stack0xffffffffffffffa0;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (char *)in_stack_ffffffffffffff68.ptr_,in_stack_ffffffffffffff60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff20),
               (int)((ulong)this_02 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    testing::Message::~Message((Message *)0x13f2b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f32e);
  this_01 = (AssertionResult *)&stack0xffffffffffffff60;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&this_02->success_,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(int *)this_01,
             (int *)in_stack_ffffffffffffff00);
  iVar5 = (int)((ulong)this_02 >> 0x20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13f3c1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff20),iVar5,
               (char *)CONCAT17(uVar3,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13f40f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f45b);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFullfilledPreconditionDoesNotFireAndThatTheInvariantWasCalled)
{
  EXPECT_NO_THROW(sut.setX(1));
  EXPECT_EQ(1, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_EQ(1, sut.postConditionWasCalled);
}